

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void node_click_proc(Am_Object *command)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Object local_60 [8];
  Am_Object lines;
  Am_Object nodes;
  Am_Value_List parents;
  int local_3c;
  int local_38;
  int i;
  int next_rank;
  int prev_rank;
  int rank;
  Am_Object local_20 [8];
  Am_Object node;
  Am_Object inter;
  Am_Object *command_local;
  
  Am_Object::Get_Owner(&node,(Am_Slot_Flags)command);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&node,0x11a);
  Am_Object::Am_Object(local_20,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)local_20,0x85);
  i = Am_Value::operator_cast_to_int(pAVar1);
  next_rank = i;
  for (local_38 = tree[i]; local_38 != next_rank; local_38 = tree[local_38]) {
    tree[next_rank] = i;
    i = next_rank;
    next_rank = local_38;
  }
  tree[next_rank] = i;
  Am_Value_List::Am_Value_List((Am_Value_List *)&nodes);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    Am_Value_List::Add(&nodes,tree[local_3c],1);
  }
  Am_Object::Get_Owner(&lines,(Am_Slot_Flags)&node);
  Am_Object::Get_Sibling(local_60,(Am_Slot_Key)&lines,(ulong)LINES);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&nodes);
  Am_Object::Set((ushort)&lines,(Am_Wrapper *)0xa2,(ulong)pAVar2);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&nodes);
  Am_Object::Set((ushort)local_60,(Am_Wrapper *)0xa2,(ulong)pAVar2);
  Am_Object::~Am_Object(local_60);
  Am_Object::~Am_Object(&lines);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&nodes);
  Am_Object::~Am_Object(local_20);
  Am_Object::~Am_Object(&node);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, node_click, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Object node = inter.Get(Am_START_OBJECT);
  int rank = node.Get(Am_RANK);
  int prev_rank = rank;
  int next_rank = tree[rank];
  while (next_rank != rank) {
    tree[rank] = prev_rank;
    prev_rank = rank;
    rank = next_rank;
    next_rank = tree[rank];
  }
  tree[rank] = prev_rank;

  int i;
  Am_Value_List parents;
  for (i = 0; i < 10; ++i)
    parents.Add(tree[i]);
  Am_Object nodes = inter.Get_Owner();
  Am_Object lines = nodes.Get_Sibling(LINES);
  nodes.Set(Am_ITEMS, parents);
  lines.Set(Am_ITEMS, parents);
}